

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O0

Rect __thiscall
GuillotineBinPack::FindPositionForNewNode
          (GuillotineBinPack *this,int width,int height,FreeRectChoiceHeuristic rectChoice,
          int *nodeIndex)

{
  Rect RVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Rect *pRVar5;
  uint local_40;
  int score;
  uint i;
  int bestScore;
  int *nodeIndex_local;
  FreeRectChoiceHeuristic rectChoice_local;
  int height_local;
  int width_local;
  GuillotineBinPack *this_local;
  Rect bestNode;
  
  memset(&this_local,0,0x10);
  score = 0x7fffffff;
  local_40 = 0;
  do {
    uVar3 = TArray<Rect,_Rect>::Size(&this->freeRectangles);
    if (uVar3 <= local_40) {
LAB_003ca0e9:
      RVar1.y = this_local._4_4_;
      RVar1.x = (int)this_local;
      RVar1.width = bestNode.x;
      RVar1.height = bestNode.y;
      return RVar1;
    }
    pRVar5 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_40);
    if ((width == pRVar5->width) &&
       (pRVar5 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_40),
       height == pRVar5->height)) {
      pRVar5 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_40);
      this_local._0_4_ = pRVar5->x;
      pRVar5 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_40);
      this_local._4_4_ = pRVar5->y;
      *nodeIndex = local_40;
      bestNode.x = width;
      bestNode.y = height;
      bVar2 = DisjointRectCollection::Disjoint(&this->disjointRects,(Rect *)&this_local);
      if (!bVar2) {
        __assert_fail("disjointRects.Disjoint(bestNode)",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/GuillotineBinPack.cpp"
                      ,0x1c1,
                      "Rect GuillotineBinPack::FindPositionForNewNode(int, int, FreeRectChoiceHeuristic, int *)"
                     );
      }
      goto LAB_003ca0e9;
    }
    pRVar5 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_40);
    if ((width <= pRVar5->width) &&
       (pRVar5 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_40),
       height <= pRVar5->height)) {
      pRVar5 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_40);
      iVar4 = ScoreByHeuristic(width,height,pRVar5,rectChoice);
      if (iVar4 < score) {
        pRVar5 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_40);
        this_local._0_4_ = pRVar5->x;
        pRVar5 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_40);
        this_local._4_4_ = pRVar5->y;
        *nodeIndex = local_40;
        bestNode.x = width;
        bestNode.y = height;
        bVar2 = DisjointRectCollection::Disjoint(&this->disjointRects,(Rect *)&this_local);
        score = iVar4;
        if (!bVar2) {
          __assert_fail("disjointRects.Disjoint(bestNode)",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/GuillotineBinPack.cpp"
                        ,0x1df,
                        "Rect GuillotineBinPack::FindPositionForNewNode(int, int, FreeRectChoiceHeuristic, int *)"
                       );
        }
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

Rect GuillotineBinPack::FindPositionForNewNode(int width, int height, FreeRectChoiceHeuristic rectChoice, int *nodeIndex)
{
	Rect bestNode;
	memset(&bestNode, 0, sizeof(Rect));

	int bestScore = INT_MAX;

	/// Try each free rectangle to find the best one for placement.
	for(unsigned i = 0; i < freeRectangles.Size(); ++i)
	{
		// If this is a perfect fit upright, choose it immediately.
		if (width == freeRectangles[i].width && height == freeRectangles[i].height)
		{
			bestNode.x = freeRectangles[i].x;
			bestNode.y = freeRectangles[i].y;
			bestNode.width = width;
			bestNode.height = height;
			bestScore = INT_MIN;
			*nodeIndex = i;
#ifdef _DEBUG
			assert(disjointRects.Disjoint(bestNode));
#endif
			break;
		}
		// If this is a perfect fit sideways, choose it.
/*		else if (height == freeRectangles[i].width && width == freeRectangles[i].height)
		{
			bestNode.x = freeRectangles[i].x;
			bestNode.y = freeRectangles[i].y;
			bestNode.width = height;
			bestNode.height = width;
			bestScore = INT_MIN;
			*nodeIndex = i;
			assert(disjointRects.Disjoint(bestNode));
			break;
		}
*/		// Does the rectangle fit upright?
		else if (width <= freeRectangles[i].width && height <= freeRectangles[i].height)
		{
			int score = ScoreByHeuristic(width, height, freeRectangles[i], rectChoice);

			if (score < bestScore)
			{
				bestNode.x = freeRectangles[i].x;
				bestNode.y = freeRectangles[i].y;
				bestNode.width = width;
				bestNode.height = height;
				bestScore = score;
				*nodeIndex = i;
#ifdef _DEBUG
				assert(disjointRects.Disjoint(bestNode));
#endif
			}
		}
		// Does the rectangle fit sideways?
/*		else if (height <= freeRectangles[i].width && width <= freeRectangles[i].height)
		{
			int score = ScoreByHeuristic(height, width, freeRectangles[i], rectChoice);

			if (score < bestScore)
			{
				bestNode.x = freeRectangles[i].x;
				bestNode.y = freeRectangles[i].y;
				bestNode.width = height;
				bestNode.height = width;
				bestScore = score;
				*nodeIndex = i;
				assert(disjointRects.Disjoint(bestNode));
			}
		}
*/	}
	return bestNode;
}